

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtableview.cpp
# Opt level: O1

void __thiscall QTableView::scrollTo(QTableView *this,QModelIndex *index,ScrollHint hint)

{
  QSpanCollection *this_00;
  long lVar1;
  long lVar2;
  char cVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  ScrollMode SVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  Span *pSVar12;
  QScrollBar *pQVar13;
  int iVar14;
  QTableViewPrivate *pQVar15;
  int iVar16;
  long in_FS_OFFSET;
  int local_70;
  int local_6c;
  QModelIndex local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (((index->r < 0) || (index->c < 0)) ||
     (lVar1 = *(long *)&(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.
                        super_QWidget.field_0x8,
     (index->m).ptr != *(QAbstractItemModel **)(lVar1 + 0x2f8))) goto LAB_00597110;
  (**(code **)(**(long **)(lVar1 + 0x2f8) + 0x68))(&local_50,*(long **)(lVar1 + 0x2f8),index);
  cVar3 = comparesEqual((QPersistentModelIndex *)(lVar1 + 0x3b8),&local_50);
  if (((cVar3 == '\0') ||
      (bVar4 = QHeaderView::isSectionHidden
                         (*(QHeaderView **)
                           (*(long *)&(this->super_QAbstractItemView).super_QAbstractScrollArea.
                                      super_QFrame.super_QWidget.field_0x8 + 0x588),index->r), bVar4
      )) || (bVar4 = QHeaderView::isSectionHidden
                               (*(QHeaderView **)
                                 (*(long *)&(this->super_QAbstractItemView).
                                            super_QAbstractScrollArea.super_QFrame.super_QWidget.
                                            field_0x8 + 0x580),index->c), bVar4)) goto LAB_00597110;
  this_00 = (QSpanCollection *)(lVar1 + 0x650);
  if (*(QSpanCollection **)(lVar1 + 0x650) == this_00) {
    iVar11 = -1;
    local_6c = 0;
    local_70 = -1;
    iVar16 = 0;
  }
  else {
    local_6c = index->r;
    iVar16 = index->c;
    pSVar12 = QSpanCollection::spanAt(this_00,iVar16,local_6c);
    iVar11 = iVar16;
    local_70 = local_6c;
    if (pSVar12 != (Span *)0x0) {
      local_70 = pSVar12->m_top;
      iVar11 = pSVar12->m_left;
      local_6c = pSVar12->m_bottom;
      iVar16 = pSVar12->m_right;
    }
    iVar16 = iVar16 + 1;
    local_6c = local_6c + 1;
  }
  lVar2 = *(long *)(*(long *)(lVar1 + 0x2b0) + 0x20);
  iVar10 = *(int *)(lVar2 + 0x1c);
  iVar9 = *(int *)(lVar2 + 0x14);
  iVar5 = QHeaderView::offset(*(QHeaderView **)(lVar1 + 0x580));
  iVar6 = QHeaderView::sectionPosition(*(QHeaderView **)(lVar1 + 0x580),index->c);
  pQVar15 = *(QTableViewPrivate **)(lVar1 + 0x580);
  iVar7 = QHeaderView::visualIndex((QHeaderView *)pQVar15,index->c);
  if (*(QSpanCollection **)(lVar1 + 0x650) == this_00) {
    iVar16 = QHeaderView::sectionSize(*(QHeaderView **)(lVar1 + 0x580),index->c);
  }
  else {
    iVar16 = QTableViewPrivate::sectionSpanSize
                       (pQVar15,*(QHeaderView **)(lVar1 + 0x580),index->c,iVar16 - iVar11);
  }
  iVar11 = (iVar10 - iVar9) + 1;
  SVar8 = QAbstractItemView::horizontalScrollMode((QAbstractItemView *)this);
  if (SVar8 == ScrollPerItem) {
    iVar10 = iVar16 + (iVar6 - iVar5);
    if ((hint == PositionAtCenter) || (iVar11 < iVar10)) {
      iVar9 = iVar7;
      iVar14 = iVar11 / 2;
      if (hint != PositionAtCenter) {
        iVar14 = iVar11;
      }
      do {
        iVar7 = iVar9;
        if (iVar7 < 1) break;
        iVar9 = QHeaderView::logicalIndex(*(QHeaderView **)(lVar1 + 0x580),iVar7 + -1);
        iVar9 = QHeaderView::sectionSize
                          (*(QHeaderView **)
                            (*(long *)&(this->super_QAbstractItemView).super_QAbstractScrollArea.
                                       super_QFrame.super_QWidget.field_0x8 + 0x580),iVar9);
        iVar16 = iVar16 + iVar9;
        iVar9 = iVar7 + -1;
      } while (iVar16 <= iVar14);
    }
    if (((hint == PositionAtCenter) || (iVar11 < iVar10)) || (iVar6 - iVar5 < 0)) {
      bVar4 = QHeaderView::sectionsHidden(*(QHeaderView **)(lVar1 + 0x580));
      iVar16 = 0;
      if (0 < iVar7 && bVar4) {
        iVar11 = iVar7 + 1;
        iVar16 = 0;
        do {
          iVar10 = QHeaderView::logicalIndex(*(QHeaderView **)(lVar1 + 0x580),iVar11 + -2);
          bVar4 = QHeaderView::isSectionHidden(*(QHeaderView **)(lVar1 + 0x580),iVar10);
          iVar16 = iVar16 + (uint)bVar4;
          iVar11 = iVar11 + -1;
        } while (1 < iVar11);
      }
      pQVar13 = QAbstractScrollArea::horizontalScrollBar((QAbstractScrollArea *)this);
      QAbstractSlider::setValue(&pQVar13->super_QAbstractSlider,iVar7 - iVar16);
    }
  }
  else {
    if (hint == PositionAtCenter) {
      pQVar13 = QAbstractScrollArea::horizontalScrollBar((QAbstractScrollArea *)this);
      iVar6 = iVar6 - (iVar11 - iVar16) / 2;
    }
    else if ((iVar6 - iVar5 < 0) || (iVar11 < iVar16)) {
      pQVar13 = QAbstractScrollArea::horizontalScrollBar((QAbstractScrollArea *)this);
    }
    else {
      if ((iVar6 - iVar5) + iVar16 <= iVar11) goto LAB_00596f09;
      pQVar13 = QAbstractScrollArea::horizontalScrollBar((QAbstractScrollArea *)this);
      iVar6 = (iVar6 - iVar11) + iVar16;
    }
    QAbstractSlider::setValue(&pQVar13->super_QAbstractSlider,iVar6);
  }
LAB_00596f09:
  lVar2 = *(long *)(*(long *)(lVar1 + 0x2b0) + 0x20);
  iVar16 = *(int *)(lVar2 + 0x20);
  iVar11 = *(int *)(lVar2 + 0x18);
  iVar9 = QHeaderView::offset(*(QHeaderView **)(lVar1 + 0x588));
  iVar10 = QHeaderView::sectionPosition(*(QHeaderView **)(lVar1 + 0x588),index->r);
  pQVar15 = *(QTableViewPrivate **)(lVar1 + 0x588);
  iVar5 = QHeaderView::visualIndex((QHeaderView *)pQVar15,index->r);
  if (*(QSpanCollection **)(lVar1 + 0x650) == this_00) {
    iVar6 = QHeaderView::sectionSize(*(QHeaderView **)(lVar1 + 0x588),index->r);
  }
  else {
    iVar6 = QTableViewPrivate::sectionSpanSize
                      (pQVar15,*(QHeaderView **)(lVar1 + 0x588),index->r,local_6c - local_70);
  }
  iVar16 = (iVar16 - iVar11) + 1;
  if ((iVar10 - iVar9 < 0) || (iVar16 < iVar6)) {
    hint = hint + (hint == EnsureVisible);
  }
  else if ((iVar16 < (iVar10 - iVar9) + iVar6) && (hint == EnsureVisible)) {
    hint = PositionAtBottom;
  }
  SVar8 = QAbstractItemView::verticalScrollMode((QAbstractItemView *)this);
  if (SVar8 == ScrollPerItem) {
    if ((hint & ~PositionAtTop) == PositionAtBottom) {
      iVar11 = iVar5;
      iVar10 = iVar16 / 2;
      if (hint != PositionAtCenter) {
        iVar10 = iVar16;
      }
      do {
        iVar5 = iVar11;
        if (iVar5 < 1) break;
        iVar16 = QHeaderView::logicalIndex(*(QHeaderView **)(lVar1 + 0x588),iVar5 + -1);
        iVar16 = QHeaderView::sectionSize(*(QHeaderView **)(lVar1 + 0x588),iVar16);
        iVar6 = iVar6 + iVar16;
        iVar11 = iVar5 + -1;
      } while (iVar6 <= iVar10);
    }
    if (hint - PositionAtTop < 3) {
      bVar4 = QHeaderView::sectionsHidden(*(QHeaderView **)(lVar1 + 0x588));
      iVar10 = 0;
      if ((bVar4) && (iVar10 = 0, 0 < iVar5)) {
        iVar16 = iVar5 + 1;
        iVar10 = 0;
        do {
          iVar11 = QHeaderView::logicalIndex(*(QHeaderView **)(lVar1 + 0x588),iVar16 + -2);
          bVar4 = QHeaderView::isSectionHidden(*(QHeaderView **)(lVar1 + 0x588),iVar11);
          iVar10 = iVar10 + (uint)bVar4;
          iVar16 = iVar16 + -1;
        } while (1 < iVar16);
      }
      pQVar13 = QAbstractScrollArea::verticalScrollBar((QAbstractScrollArea *)this);
      iVar10 = iVar5 - iVar10;
      goto LAB_00597100;
    }
  }
  else {
    if (hint == PositionAtCenter) {
      pQVar13 = QAbstractScrollArea::verticalScrollBar((QAbstractScrollArea *)this);
      iVar10 = iVar10 - (iVar16 - iVar6) / 2;
    }
    else if (hint == PositionAtBottom) {
      pQVar13 = QAbstractScrollArea::verticalScrollBar((QAbstractScrollArea *)this);
      iVar10 = (iVar10 - iVar16) + iVar6;
    }
    else {
      if (hint != PositionAtTop) goto LAB_00597105;
      pQVar13 = QAbstractScrollArea::verticalScrollBar((QAbstractScrollArea *)this);
    }
LAB_00597100:
    QAbstractSlider::setValue(&pQVar13->super_QAbstractSlider,iVar10);
  }
LAB_00597105:
  QAbstractItemView::update((QAbstractItemView *)this,index);
LAB_00597110:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTableView::scrollTo(const QModelIndex &index, ScrollHint hint)
{
    Q_D(QTableView);

    // check if we really need to do anything
    if (!d->isIndexValid(index)
        || (d->model->parent(index) != d->root)
        || isRowHidden(index.row()) || isColumnHidden(index.column()))
        return;

    QSpanCollection::Span span;
    if (d->hasSpans())
        span = d->span(index.row(), index.column());

    // Adjust horizontal position

    int viewportWidth = d->viewport->width();
    int horizontalOffset = d->horizontalHeader->offset();
    int horizontalPosition = d->horizontalHeader->sectionPosition(index.column());
    int horizontalIndex = d->horizontalHeader->visualIndex(index.column());
    int cellWidth = d->hasSpans()
                    ? d->columnSpanWidth(index.column(), span.width())
                    : d->horizontalHeader->sectionSize(index.column());

    if (horizontalScrollMode() == QAbstractItemView::ScrollPerItem) {

        bool positionAtLeft = (horizontalPosition - horizontalOffset < 0);
        bool positionAtRight = (horizontalPosition - horizontalOffset + cellWidth > viewportWidth);

        if (hint == PositionAtCenter || positionAtRight) {
            int w = (hint == PositionAtCenter ? viewportWidth / 2 : viewportWidth);
            int x = cellWidth;
            while (horizontalIndex > 0) {
                x += columnWidth(d->horizontalHeader->logicalIndex(horizontalIndex-1));
                if (x > w)
                    break;
                --horizontalIndex;
            }
        }

        if (positionAtRight || hint == PositionAtCenter || positionAtLeft) {
            int hiddenSections = 0;
            if (d->horizontalHeader->sectionsHidden()) {
                for (int s = horizontalIndex - 1; s >= 0; --s) {
                    int column = d->horizontalHeader->logicalIndex(s);
                    if (d->horizontalHeader->isSectionHidden(column))
                        ++hiddenSections;
                }
            }
            horizontalScrollBar()->setValue(horizontalIndex - hiddenSections);
        }

    } else { // ScrollPerPixel
        if (hint == PositionAtCenter) {
            horizontalScrollBar()->setValue(horizontalPosition - ((viewportWidth - cellWidth) / 2));
        } else {
            if (horizontalPosition - horizontalOffset < 0 || cellWidth > viewportWidth)
                horizontalScrollBar()->setValue(horizontalPosition);
            else if (horizontalPosition - horizontalOffset + cellWidth > viewportWidth)
                horizontalScrollBar()->setValue(horizontalPosition - viewportWidth + cellWidth);
        }
    }

    // Adjust vertical position

    int viewportHeight = d->viewport->height();
    int verticalOffset = d->verticalHeader->offset();
    int verticalPosition = d->verticalHeader->sectionPosition(index.row());
    int verticalIndex = d->verticalHeader->visualIndex(index.row());
    int cellHeight = d->hasSpans()
                     ? d->rowSpanHeight(index.row(), span.height())
                     : d->verticalHeader->sectionSize(index.row());

    if (verticalPosition - verticalOffset < 0 || cellHeight > viewportHeight) {
        if (hint == EnsureVisible)
            hint = PositionAtTop;
    } else if (verticalPosition - verticalOffset + cellHeight > viewportHeight) {
        if (hint == EnsureVisible)
            hint = PositionAtBottom;
    }

    if (verticalScrollMode() == QAbstractItemView::ScrollPerItem) {

        if (hint == PositionAtBottom || hint == PositionAtCenter) {
            int h = (hint == PositionAtCenter ? viewportHeight / 2 : viewportHeight);
            int y = cellHeight;
            while (verticalIndex > 0) {
                int row = d->verticalHeader->logicalIndex(verticalIndex - 1);
                y += d->verticalHeader->sectionSize(row);
                if (y > h)
                    break;
                --verticalIndex;
            }
        }

        if (hint == PositionAtBottom || hint == PositionAtCenter || hint == PositionAtTop) {
            int hiddenSections = 0;
            if (d->verticalHeader->sectionsHidden()) {
                for (int s = verticalIndex - 1; s >= 0; --s) {
                    int row = d->verticalHeader->logicalIndex(s);
                    if (d->verticalHeader->isSectionHidden(row))
                        ++hiddenSections;
                }
            }
            verticalScrollBar()->setValue(verticalIndex - hiddenSections);
        }

    } else { // ScrollPerPixel
        if (hint == PositionAtTop) {
            verticalScrollBar()->setValue(verticalPosition);
        } else if (hint == PositionAtBottom) {
            verticalScrollBar()->setValue(verticalPosition - viewportHeight + cellHeight);
        } else if (hint == PositionAtCenter) {
            verticalScrollBar()->setValue(verticalPosition - ((viewportHeight - cellHeight) / 2));
        }
    }

    update(index);
}